

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::File> * __thiscall asl::Array<asl::File>::resize(Array<asl::File> *this,int m)

{
  uint uVar1;
  File *pFVar2;
  File *pFVar3;
  long lVar4;
  
  uVar1 = this->_a[-1]._info.flags;
  reserve(this,m);
  if ((int)uVar1 < m) {
    pFVar2 = this->_a + (int)uVar1;
    pFVar3 = pFVar2 + (int)(m - uVar1);
    do {
      pFVar2->_file = (FILE *)0x0;
      (pFVar2->_path)._size = 0;
      (pFVar2->_path)._len = 0;
      (pFVar2->_path).field_2._space[0] = '\0';
      (pFVar2->_info).size = -1;
      (pFVar2->_info).lastModified._t = 0.0;
      (pFVar2->_info).creationDate._t = 0.0;
      (pFVar2->_info).flags = 0;
      pFVar2->_endian = ENDIAN_NATIVE;
      pFVar2 = pFVar2 + 1;
    } while (pFVar2 != pFVar3);
  }
  else if (m < (int)uVar1) {
    pFVar3 = this->_a + m;
    lVar4 = (long)(int)uVar1 * 0x48 + (long)m * -0x48;
    do {
      File::~File(pFVar3);
      pFVar3 = pFVar3 + 1;
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != 0);
  }
  this->_a[-1]._info.flags = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}